

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

Am_Object * __thiscall
Am_Object::Add_Part(Am_Object *this,Am_Slot_Key key,Am_Object *new_part,Am_Slot_Flags set_flags)

{
  uint *puVar1;
  unsigned_short *puVar2;
  Am_Object_Data *pAVar3;
  Am_Object_Data *pAVar4;
  Am_Part_Demon *pAVar5;
  Am_Constraint_Context *pAVar6;
  Am_Slot_Data *slot;
  ostream *poVar7;
  Am_Object *unaff_RBX;
  CItem *pCVar8;
  Am_Object prev_part;
  Am_Object obj;
  Am_Value newval;
  Am_Slot_Data *new_slot;
  Am_Object AVar9;
  Am_Object AVar10;
  Am_Object in_stack_ffffffffffffff60;
  anon_union_8_8_ea4c8939_for_value in_stack_ffffffffffffff68;
  Am_Object *local_90;
  Am_Slot_Data *local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Slot_Data *local_50;
  Am_Value local_48;
  Am_Slot_Data *local_38;
  
  if (this->data != (Am_Object_Data *)0x0) {
    slot = Am_Object_Data::find_slot(this->data,key);
    AVar9.data = (Am_Object_Data *)0x0;
    AVar10.data = AVar9.data;
    if ((slot != (Am_Slot_Data *)0x0) && ((slot->super_Am_Value).type != 0x1002)) {
      if ((slot->field_0x38 & 0x20) == 0) {
        if ((set_flags & 8) == 0) {
          AVar10.data = slot->context;
          puVar1 = &((AVar10.data)->super_Am_Wrapper).refs;
          *puVar1 = *puVar1 + 1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "** Add_Part can only be called with slots that are not already in the object.  But Object "
                     ,0x5a);
          if (AVar10.data == (Am_Object_Data *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"(0L) Object",0xb);
          }
          else {
            (*((AVar10.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[2]
            )(AVar10.data,&std::cerr);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr," already has slot ",0x12);
          Am_Print_Key((ostream *)&std::cerr,slot->key);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,".\n",2);
          if (Am_Object_Debugger != (_func_void_Am_Object_ptr_Am_Slot_Key *)0x0) {
            (*Am_Object_Debugger)((Am_Object *)&stack0xffffffffffffff60,slot->key);
          }
          Am_Error();
        }
      }
      else {
        if ((set_flags & 8) == 0) {
          slot_error("Add_Part called on part slot which is already there.  Use Set_Part instead",
                     slot);
        }
        AVar10.data = in_stack_ffffffffffffff60.data;
        Get_Object((Am_Object *)&stack0xffffffffffffff60,(Am_Slot_Key)this,(ulong)key);
        if (AVar10.data != (Am_Object_Data *)0x0) {
          puVar1 = &((AVar10.data)->super_Am_Wrapper).refs;
          *puVar1 = *puVar1 + 1;
        }
        in_stack_ffffffffffffff60.data = AVar10.data;
        if (AVar9.data != (Am_Object_Data *)0x0) {
          puVar1 = &((AVar9.data)->super_Am_Wrapper).refs;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            (*((AVar9.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])
                      ();
          }
        }
        ~Am_Object((Am_Object *)&stack0xffffffffffffff60);
      }
    }
    pAVar3 = new_part->data;
    if ((pAVar3 != (Am_Object_Data *)0x0) && ((pAVar3->data).data != (char *)0x0)) {
      unaff_RBX = this;
      local_90 = new_part;
      if ((pAVar3->owner_slot).super_Am_Value.value.wrapper_value != (Am_Wrapper *)0x0)
      goto LAB_001cb22f;
      if (slot != (Am_Slot_Data *)0x0) {
        Remove_Slot(this,key);
      }
      puVar1 = &(pAVar3->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 + 1;
      (pAVar3->owner_slot).super_Am_Value.value = (anon_union_8_8_ea4c8939_for_value)this->data;
      pAVar4 = this->data;
      local_50 = &pAVar3->part_slot;
      (pAVar3->part_slot).context = pAVar4;
      pAVar3->next_part = pAVar4->first_part;
      pAVar4->first_part = pAVar3;
      (pAVar3->part_slot).key = key;
      local_38 = local_50;
      DynArray::Add(&pAVar4->data,(char *)&local_38);
      puVar2 = &((this->data->demon_queue).data)->invoke_stack;
      *puVar2 = *puVar2 + 1;
      pAVar6 = cc;
      cc = Am_Empty_Constraint_Context;
      if (((short)this->data->demons_active < 0) &&
         (pAVar5 = this->data->demon_set->add_part_demon, pAVar5 != (Am_Part_Demon *)0x0)) {
        Am_Object(&local_58,this);
        Am_Object(&local_60,&Am_No_Object);
        Am_Object(&local_68,new_part);
        (*pAVar5)(AVar10,in_stack_ffffffffffffff60,(Am_Object)in_stack_ffffffffffffff68);
        ~Am_Object(&local_68);
        ~Am_Object(&local_60);
        ~Am_Object(&local_58);
      }
      if (((short)pAVar3->demons_active < 0) &&
         (pAVar5 = pAVar3->demon_set->change_owner_demon, pAVar5 != (Am_Part_Demon *)0x0)) {
        Am_Object(&local_70,new_part);
        local_78.data = (Am_Object_Data *)0x0;
        Am_Object(&local_80,this);
        (*pAVar5)(AVar10,in_stack_ffffffffffffff60,(Am_Object)in_stack_ffffffffffffff68);
        ~Am_Object(&local_80);
        ~Am_Object(&local_78);
        ~Am_Object(&local_70);
      }
      pAVar4 = this->data;
      puVar2 = &((pAVar4->demon_queue).data)->invoke_stack;
      cc = pAVar6;
      *puVar2 = *puVar2 - 1;
      puVar1 = &(pAVar4->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 + 1;
      Am_Value::Am_Value((Am_Value *)&stack0xffffffffffffff60,(Am_Wrapper *)0x0);
      Am_Value::Am_Value(&local_48,&this->data->super_Am_Wrapper);
      local_88 = local_50;
      pCVar8 = (pAVar3->owner_slot).dependencies.head;
      if (pCVar8 != (CItem *)0x0) {
        do {
          (*(pCVar8->value->super_Am_Registered_Type)._vptr_Am_Registered_Type[7])
                    (pCVar8->value,&local_88,0,&stack0xffffffffffffff60,&local_48);
          pCVar8 = pCVar8->next;
        } while (pCVar8 != (CItem *)0x0);
      }
      AVar9.data = Am_No_Object.data;
      if (Am_No_Object.data != (Am_Object_Data *)0x0) {
        puVar1 = &((Am_No_Object.data)->super_Am_Wrapper).refs;
        *puVar1 = *puVar1 + 1;
      }
      Am_Value::operator=((Am_Value *)&stack0xffffffffffffff60,&(AVar9.data)->super_Am_Wrapper);
      pAVar4 = new_part->data;
      if (pAVar4 != (Am_Object_Data *)0x0) {
        puVar1 = &(pAVar4->super_Am_Wrapper).refs;
        *puVar1 = *puVar1 + 1;
      }
      Am_Value::operator=(&local_48,&pAVar4->super_Am_Wrapper);
      local_88 = local_50;
      pCVar8 = (pAVar3->part_slot).dependencies.head;
      if (pCVar8 != (CItem *)0x0) {
        do {
          (*(pCVar8->value->super_Am_Registered_Type)._vptr_Am_Registered_Type[7])
                    (pCVar8->value,&local_88,0,&stack0xffffffffffffff60,&local_48);
          pCVar8 = pCVar8->next;
        } while (pCVar8 != (CItem *)0x0);
      }
      if ((AVar10.data != (Am_Object_Data *)0x0) && (((AVar10.data)->data).data != (char *)0x0)) {
        Destroy((Am_Object *)&stack0xffffffffffffff58);
      }
      Am_Value::~Am_Value(&local_48);
      Am_Value::~Am_Value((Am_Value *)&stack0xffffffffffffff60);
    }
    ~Am_Object((Am_Object *)&stack0xffffffffffffff58);
    return this;
  }
  slot_error("Add_Part called on a (0L) object",key);
LAB_001cb22f:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"** Attempted to add object, ",0x1c);
  ::operator<<((ostream *)&std::cerr,local_90);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", to object, ",0xd);
  ::operator<<((ostream *)&std::cerr,unaff_RBX);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,", when it already has owner, ",0x1d);
  poVar7 = std::ostream::_M_insert<void_const*>(&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** Amulet_Error: ",0x11)
  ;
  ::operator<<((ostream *)&std::cerr,local_90);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  Am_Error();
}

Assistant:

Am_Object &
Am_Object::Add_Part(Am_Slot_Key key, Am_Object new_part,
                    Am_Slot_Flags set_flags)
{
  if (!data)
    slot_error("Add_Part called on a (0L) object", key);
  Am_Slot_Data *slot = data->find_slot(key);
  Am_Object prev_part;
  if (slot && slot->type != Am_MISSING_SLOT) {
    if ((slot->flags & BIT_IS_PART)) {
      if (!(set_flags & Am_OK_IF_THERE)) {
        slot_error("Add_Part called on part slot which is already there.  "
                   "Use Set_Part instead",
                   slot);
        return Am_No_Object;
      }
      prev_part = Get_Object(key); //not very efficient, but safer
    } else {
      if (!(set_flags & Am_OK_IF_THERE)) {
        slot->context->Note_Reference();
        Am_Object obj = Am_Object(slot->context);
        std::cerr << "** Add_Part can only be called with slots that are not "
                     "already in the object.  But Object "
                  << obj << " already has slot ";
        Am_Print_Key(std::cerr, slot->key);
        std::cerr << ".\n";
        Am_Error(obj, slot->key);
        return Am_No_Object;
      }
    }
  }
  if (new_part.Valid()) {
    Am_Object_Data *added_part = new_part.data;
    Am_Object_Data *prev_owner =
        (Am_Object_Data *)added_part->owner_slot.value.wrapper_value;
    if (prev_owner) {
      std::cerr << "** Attempted to add object, " << new_part << ", to object, "
                << *this << ", when it already has owner, " << prev_owner << "."
                << std::endl;
      Am_ERROR(new_part);
    }
    if (slot)
      Remove_Slot(key); //if old slot exists, remove it

    added_part->Note_Reference();
    added_part->owner_slot.value.wrapper_value = data;
    added_part->part_slot.context = data;
    added_part->next_part = data->first_part;
    data->first_part = added_part;
    added_part->part_slot.key = key;
    Am_Slot_Data *new_slot = &(added_part->part_slot);
    data->data.Add((char *)&new_slot);
    data->demon_queue.Prevent_Invoke();
    Am_PUSH_EMPTY_CC() if ((data->demons_active & DEMONS_ACTIVE) &&
                           data->demon_set->add_part_demon)
        data->demon_set->add_part_demon(*this, Am_No_Object, new_part);
    if ((added_part->demons_active & DEMONS_ACTIVE) &&
        added_part->demon_set->change_owner_demon)
      added_part->demon_set->change_owner_demon(new_part, Am_Object(prev_owner),
                                                *this);
    Am_POP_EMPTY_CC() data->demon_queue.Release_Invoke();
    if (prev_owner)
      prev_owner->Note_Reference();
    data->Note_Reference();
    Am_Value oldval(prev_owner), newval(data);
    added_part->owner_slot.dependencies.Change(&added_part->part_slot, nullptr,
                                               oldval, newval);
    oldval = Am_No_Object;
    newval = new_part;
    added_part->part_slot.dependencies.Change(&added_part->part_slot, nullptr,
                                              oldval, newval);
    if (prev_part.Valid())
      prev_part.Destroy();
  }
  return *this;
}